

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeasurementFactory.cpp
# Opt level: O0

Measurement * __thiscall
MeasurementFactory::CreateMeasurement
          (MeasurementFactory *this,istringstream *iss,SensorContainer *sensors)

{
  Measurement *pMVar1;
  mapped_type *ppSVar2;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar3;
  long local_1b0;
  long local_1a0;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_158;
  Matrix<double,__1,_1,_0,__1,_1> local_138;
  float local_128;
  float local_124;
  float vy_gt;
  float vx_gt;
  float y_gt;
  float x_gt;
  Measurement *m;
  double local_108;
  double local_100;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_f8;
  float local_d4;
  float local_d0;
  float rho_dot;
  float theta;
  float rho;
  double local_c0;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_b8;
  float local_98;
  float local_94;
  float py;
  float px;
  VectorXd measurements;
  out_of_range *e;
  long local_60;
  long timestamp;
  iterator si;
  Sensor *sensor;
  string sensor_type;
  SensorContainer *sensors_local;
  istringstream *iss_local;
  MeasurementFactory *this_local;
  
  std::__cxx11::string::string((string *)&sensor);
  si._M_node = (_Base_ptr)0x0;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>
  ::_Rb_tree_iterator((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>
                       *)&timestamp);
  std::operator>>((istream *)iss,(string *)&sensor);
  ppSVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
            ::at(sensors,(key_type *)&sensor);
  si._M_node = (_Base_ptr)*ppSVar2;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)&py,(long)((mapped_type)si._M_node)->df_);
  if (si._M_node == (_Base_ptr)0x0) {
    local_1a0 = 0;
  }
  else {
    local_1a0 = __dynamic_cast(si._M_node,&Sensor::typeinfo,&LidarSensor::typeinfo,0);
  }
  if (local_1a0 == 0) {
    if (si._M_node == (_Base_ptr)0x0) {
      local_1b0 = 0;
    }
    else {
      local_1b0 = __dynamic_cast(si._M_node,&Sensor::typeinfo,&RadarSensor::typeinfo,0);
    }
    if (local_1b0 != 0) {
      std::istream::operator>>((istream *)iss,&rho_dot);
      std::istream::operator>>((istream *)iss,&local_d0);
      std::istream::operator>>((istream *)iss,&local_d4);
      local_100 = (double)rho_dot;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
                (&local_f8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&py,&local_100);
      local_108 = (double)local_d0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (&local_f8,&local_108);
      m = (Measurement *)(double)local_d4;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                (pCVar3,(Scalar *)&m);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_f8)
      ;
    }
  }
  else {
    std::istream::operator>>((istream *)iss,&local_94);
    std::istream::operator>>((istream *)iss,&local_98);
    local_c0 = (double)local_94;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
              (&local_b8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&py,&local_c0);
    _theta = (double)local_98;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              (&local_b8,(Scalar *)&theta);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_b8);
  }
  std::istream::operator>>((istream *)iss,&local_60);
  _y_gt = CreateMeasurement(this,(Sensor *)si._M_node,local_60,(VectorXd *)&py);
  if (_y_gt != (Measurement *)0x0) {
    std::istream::operator>>((istream *)iss,&vx_gt);
    std::istream::operator>>((istream *)iss,&vy_gt);
    std::istream::operator>>((istream *)iss,&local_124);
    std::istream::operator>>((istream *)iss,&local_128);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&local_138,4);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&_y_gt->ground_truth_,&local_138);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_138);
    local_160 = (double)vx_gt;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
              (&local_158,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&_y_gt->ground_truth_,
               &local_160);
    local_168 = (double)vy_gt;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (&local_158,&local_168);
    local_170 = (double)local_124;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar3,&local_170);
    local_178 = (double)local_128;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar3,&local_178);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_158);
  }
  pMVar1 = _y_gt;
  measurements.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_
       = 1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&py);
  std::__cxx11::string::~string((string *)&sensor);
  return pMVar1;
}

Assistant:

Measurement *MeasurementFactory::CreateMeasurement(std::istringstream &iss, const SensorContainer &sensors) {

    string sensor_type;
    const Sensor *sensor = 0;
    SensorContainer::iterator si;
    long timestamp;

    iss >> sensor_type;

    try {
        sensor = sensors.at(sensor_type);
    } catch (const std::out_of_range &e) {
        // discard measurement because sensor not valid
   	//std::cout << "Invalid sensor type" << std::endl;
        return 0;
    }

    VectorXd measurements(sensor->df_);

    if (dynamic_cast<const LidarSensor*>(sensor) != 0) {
      float px;
      float py;
      
      iss >> px;
      iss >> py;

      measurements << px, py;

    } else if (dynamic_cast<const RadarSensor*>(sensor) != 0) {
      float rho;
      float theta;
      float rho_dot;

      iss >> rho;
      iss >> theta;
      iss >> rho_dot;

      measurements << rho, theta, rho_dot;
    }   

    iss >> timestamp;

    Measurement *m = CreateMeasurement(sensor, timestamp, measurements);

    // read ground truth data and store it with the measurement
    if (m) {

        float x_gt;
        float y_gt;
        float vx_gt;
        float vy_gt;
        iss >> x_gt;
        iss >> y_gt;
        iss >> vx_gt;
        iss >> vy_gt;
	m->ground_truth_ = VectorXd(4);
        m->ground_truth_  << x_gt, y_gt, vx_gt, vy_gt;
    }

    return m;
}